

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

Bit32u __thiscall
MT32Emu::LA32WaveGenerator::getHighLinearLength(LA32WaveGenerator *this,Bit32u effectiveCutoffValue)

{
  Bit16u BVar1;
  Bit32u local_1c;
  Bit32u expArg;
  Bit32u highLinearLength;
  Bit32u effectivePulseWidthValue;
  Bit32u effectiveCutoffValue_local;
  LA32WaveGenerator *this_local;
  
  expArg = 0;
  if (0x80 < this->pulseWidth) {
    expArg = (this->pulseWidth - 0x80) * 0x40;
  }
  local_1c = 0;
  if (expArg < effectiveCutoffValue) {
    BVar1 = LA32Utilites::interpolateExp(((ushort)(effectiveCutoffValue - expArg) ^ 0xffff) & 0xfff)
    ;
    local_1c = ((uint)BVar1 << ((char)(effectiveCutoffValue - expArg >> 0xc) + 7U & 0x1f)) - 0x80000
    ;
  }
  return local_1c;
}

Assistant:

Bit32u LA32WaveGenerator::getHighLinearLength(Bit32u effectiveCutoffValue) {
	// Ratio of positive segment to wave length
	Bit32u effectivePulseWidthValue = 0;
	if (pulseWidth > 128) {
		effectivePulseWidthValue = (pulseWidth - 128) << 6;
	}

	Bit32u highLinearLength = 0;
	// highLinearLength = EXP2F(19.0f - effectivePulseWidthValue / 4096.0f + effectiveCutoffValue / 4096.0f) - 2 * SINE_SEGMENT_RELATIVE_LENGTH;
	if (effectivePulseWidthValue < effectiveCutoffValue) {
		Bit32u expArg = effectiveCutoffValue - effectivePulseWidthValue;
		highLinearLength = LA32Utilites::interpolateExp(~expArg & 4095);
		highLinearLength <<= 7 + (expArg >> 12);
		highLinearLength -= 2 * SINE_SEGMENT_RELATIVE_LENGTH;
	}
	return highLinearLength;
}